

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O3

void Shell::Shuffling::shuffleTwoList<unsigned_int,Kernel::TermList>
               (List<unsigned_int> **list1,List<Kernel::TermList> **list2)

{
  uint64_t uVar1;
  ulong uVar2;
  List<unsigned_int> *pLVar3;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *__s;
  List<unsigned_int> *pLVar4;
  List<Kernel::TermList> *pLVar5;
  ulong uVar6;
  List<Kernel::TermList> **ppLVar7;
  List<Kernel::TermList> *pLVar8;
  uint uVar9;
  long lVar10;
  pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *res;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> aux;
  DArray<std::pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*>_> local_58;
  List<unsigned_int> **local_40;
  List<Kernel::TermList> **local_38;
  
  pLVar3 = *list1;
  if (pLVar3 != (List<unsigned_int> *)0x0) {
    uVar9 = 0;
    do {
      uVar9 = uVar9 + 1;
      pLVar3 = pLVar3->_tail;
    } while (pLVar3 != (List<unsigned_int> *)0x0);
    if (1 < uVar9) {
      uVar6 = (ulong)uVar9;
      local_58._size = uVar6;
      local_58._capacity = uVar6;
      if (uVar9 == 2) {
        __s = (pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)
              Lib::FixedSizeAllocator<32UL>::alloc
                        ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
      }
      else if (uVar9 < 4) {
        __s = (pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)
              Lib::FixedSizeAllocator<48UL>::alloc
                        ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
      }
      else if (uVar9 == 4) {
        __s = (pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)
              Lib::FixedSizeAllocator<64UL>::alloc
                        ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
      }
      else {
        __s = (pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)
              ::operator_new(uVar6 << 4,0x10);
      }
      memset(__s,0,uVar6 << 4);
      ppLVar7 = list2;
      uVar2 = 0;
      for (pLVar3 = *list1; pLVar3 != (List<unsigned_int> *)0x0; pLVar3 = pLVar3->_tail) {
        pLVar8 = *ppLVar7;
        __s[uVar2].first = pLVar3;
        __s[uVar2].second = pLVar8;
        ppLVar7 = &pLVar8->_tail;
        uVar2 = (ulong)((int)uVar2 + 1);
      }
      local_58._array = __s;
      local_40 = list1;
      local_38 = list2;
      shuffleArray<Lib::DArray<std::pair<Lib::List<unsigned_int>*,Lib::List<Kernel::TermList>*>>>
                (&local_58,uVar9);
      lVar10 = 0;
      pLVar8 = (List<Kernel::TermList> *)0x0;
      pLVar3 = (List<unsigned_int> *)0x0;
      do {
        uVar9 = **(uint **)((long)&(local_58._array)->first + lVar10);
        pLVar4 = (List<unsigned_int> *)
                 Lib::FixedSizeAllocator<16UL>::alloc
                           ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
        ;
        pLVar4->_head = uVar9;
        pLVar4->_tail = pLVar3;
        uVar1 = **(uint64_t **)((long)&(local_58._array)->second + lVar10);
        pLVar5 = (List<Kernel::TermList> *)
                 Lib::FixedSizeAllocator<16UL>::alloc
                           ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
        ;
        (pLVar5->_head)._content = uVar1;
        pLVar5->_tail = pLVar8;
        lVar10 = lVar10 + 0x10;
        pLVar8 = pLVar5;
        pLVar3 = pLVar4;
      } while ((uVar6 + (uVar6 == 0)) * 0x10 != lVar10);
      *local_40 = pLVar4;
      *local_38 = pLVar5;
      if (local_58._array != (pair<Lib::List<unsigned_int>_*,_Lib::List<Kernel::TermList>_*> *)0x0)
      {
        uVar6 = local_58._capacity << 4;
        if (uVar6 == 0) {
          (local_58._array)->first = (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_
          ;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._array;
        }
        else if (uVar6 < 0x11) {
          (local_58._array)->first = (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_
          ;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._array;
        }
        else if (uVar6 < 0x19) {
          (local_58._array)->first = (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_
          ;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._array;
        }
        else if (uVar6 < 0x21) {
          (local_58._array)->first = (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_
          ;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._array;
        }
        else if (uVar6 < 0x31) {
          (local_58._array)->first =
               (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._array;
        }
        else if (uVar6 < 0x41) {
          (local_58._array)->first =
               (List<unsigned_int> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._array;
        }
        else {
          operator_delete(local_58._array,0x10);
        }
      }
    }
  }
  return;
}

Assistant:

static void shuffleTwoList(List<T>*& list1, List<S>*& list2) {
    unsigned len = List<T>::length(list1);

    if (len <= 1) {
      return;
    }

    DArray<std::pair<List<T>*,List<S>*>> aux(len);
    unsigned idx = 0;

    List<T>* els1 = list1;
    List<S>* els2 = list2;
    while (els1 != nullptr) {
      ASS_NEQ(els2,0);
      aux[idx++] = std::make_pair(els1,els2);
      els1 = els1->tail();
      els2 = els2->tail();
    }
    ASS_EQ(els2,0);
    shuffleArray(aux,len);

    // create the new lists
    List<T>* res1 = nullptr;
    List<S>* res2 = nullptr;
    for(idx = 0; idx < len; idx++) {
      res1 = List<T>::cons(aux[idx].first->head(),res1);
      res2 = List<S>::cons(aux[idx].second->head(),res2);
    }

    // List<T>::destroy(list1);
    // List<S>::destroy(list2);

    list1 = res1;
    list2 = res2;
  }